

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureFilterMinmaxTests.cpp
# Opt level: O0

IterateResult __thiscall
gl4cts::TextureFilterMinmaxParameterQueriesTestCase::iterate
          (TextureFilterMinmaxParameterQueriesTestCase *this)

{
  ReductionModeParamIter gl_00;
  bool bVar1;
  int iVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  vector<gl4cts::TextureFilterMinmaxUtils::ReductionModeParam,_std::allocator<gl4cts::TextureFilterMinmaxUtils::ReductionModeParam>_>
  *pvVar4;
  pointer pRVar5;
  __normal_iterator<const_gl4cts::TextureFilterMinmaxUtils::ReductionModeParam_*,_std::vector<gl4cts::TextureFilterMinmaxUtils::ReductionModeParam,_std::allocator<gl4cts::TextureFilterMinmaxUtils::ReductionModeParam>_>_>
  local_28;
  __normal_iterator<const_gl4cts::TextureFilterMinmaxUtils::ReductionModeParam_*,_std::vector<gl4cts::TextureFilterMinmaxUtils::ReductionModeParam,_std::allocator<gl4cts::TextureFilterMinmaxUtils::ReductionModeParam>_>_>
  local_20;
  ReductionModeParamIter iter;
  Functions *gl;
  TextureFilterMinmaxParameterQueriesTestCase *this_local;
  
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar3->_vptr_RenderContext[3])();
  iter._M_current = (ReductionModeParam *)CONCAT44(extraout_var,iVar2);
  testReductionModeQueriesDefaultValues(this,(Functions *)iter._M_current);
  pvVar4 = TextureFilterMinmaxUtils::getReductionModeParams(&this->m_utils);
  local_20._M_current =
       (ReductionModeParam *)
       std::
       vector<gl4cts::TextureFilterMinmaxUtils::ReductionModeParam,_std::allocator<gl4cts::TextureFilterMinmaxUtils::ReductionModeParam>_>
       ::begin(pvVar4);
  while( true ) {
    pvVar4 = TextureFilterMinmaxUtils::getReductionModeParams(&this->m_utils);
    local_28._M_current =
         (ReductionModeParam *)
         std::
         vector<gl4cts::TextureFilterMinmaxUtils::ReductionModeParam,_std::allocator<gl4cts::TextureFilterMinmaxUtils::ReductionModeParam>_>
         ::end(pvVar4);
    bVar1 = __gnu_cxx::operator!=(&local_20,&local_28);
    gl_00 = iter;
    if (!bVar1) break;
    pRVar5 = __gnu_cxx::
             __normal_iterator<const_gl4cts::TextureFilterMinmaxUtils::ReductionModeParam_*,_std::vector<gl4cts::TextureFilterMinmaxUtils::ReductionModeParam,_std::allocator<gl4cts::TextureFilterMinmaxUtils::ReductionModeParam>_>_>
             ::operator->(&local_20);
    testReductionModeQueries(this,(Functions *)gl_00._M_current,pRVar5->m_reductionMode);
    __gnu_cxx::
    __normal_iterator<const_gl4cts::TextureFilterMinmaxUtils::ReductionModeParam_*,_std::vector<gl4cts::TextureFilterMinmaxUtils::ReductionModeParam,_std::allocator<gl4cts::TextureFilterMinmaxUtils::ReductionModeParam>_>_>
    ::operator++(&local_20);
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult TextureFilterMinmaxParameterQueriesTestCase::iterate()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	testReductionModeQueriesDefaultValues(gl);

	for (TextureFilterMinmaxUtils::ReductionModeParamIter iter = m_utils.getReductionModeParams().begin();
		 iter != m_utils.getReductionModeParams().end(); ++iter)
	{
		testReductionModeQueries(gl, iter->m_reductionMode);
	}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	return STOP;
}